

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O0

void __thiscall lzstring::LZString::CreateBaseDict(LZString *this,string *alphabet,CharDict *dict)

{
  ulong uVar1;
  key_type *__k;
  mapped_type *pmVar2;
  undefined8 local_28;
  size_t index;
  CharDict *dict_local;
  string *alphabet_local;
  LZString *this_local;
  
  std::
  unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
  ::clear(dict);
  local_28 = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= local_28) break;
    __k = (key_type *)std::__cxx11::string::operator[]((ulong)alphabet);
    pmVar2 = std::
             unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
             ::operator[](dict,__k);
    *pmVar2 = (mapped_type)local_28;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void LZString::CreateBaseDict(const std::string &alphabet, CharDict &dict)
{
	dict.clear();
	for (size_t index = 0; index < alphabet.size(); index++)
	{
		dict[alphabet[index]] = (char)index;
	}
}